

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceArrayIntersectorK<8>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  uint uVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  NodeRef nodeRef;
  Primitive_conflict4 *prim;
  ulong uVar26;
  ulong *puVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  vint4 bi;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar56 [64];
  Precalculations pre;
  vbool<8> valid_leaf;
  vint8 bi_1;
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1301;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_1300;
  AccelData *local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  RayHitK<8> *local_12c0;
  RayQueryContext *local_12b8;
  long local_12b0;
  ulong local_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1270 [16];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  uint local_11d0;
  uint uStack_11cc;
  uint uStack_11c8;
  uint uStack_11c4;
  undefined4 local_11c0;
  undefined4 uStack_11bc;
  undefined4 uStack_11b8;
  undefined4 uStack_11b4;
  uint local_11b0;
  uint uStack_11ac;
  uint uStack_11a8;
  uint uStack_11a4;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  uint local_1170;
  uint uStack_116c;
  uint uStack_1168;
  uint uStack_1164;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  uint local_1150;
  uint uStack_114c;
  uint uStack_1148;
  uint uStack_1144;
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  uint local_1110;
  uint uStack_110c;
  uint uStack_1108;
  uint uStack_1104;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  
  auVar9 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar30 = vpcmpeqd_avx2(auVar9,(undefined1  [32])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar30);
  if (uVar16 == 0) {
    return;
  }
  local_12e0 = This->ptr;
  local_12d8 = (ulong)(uVar16 & 0xff);
  auVar4 = *(undefined1 (*) [32])(ray + 0x80);
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  auVar41._16_4_ = 0x7fffffff;
  auVar41._20_4_ = 0x7fffffff;
  auVar41._24_4_ = 0x7fffffff;
  auVar41._28_4_ = 0x7fffffff;
  auVar43._8_4_ = 0x219392ef;
  auVar43._0_8_ = 0x219392ef219392ef;
  auVar43._12_4_ = 0x219392ef;
  auVar43._16_4_ = 0x219392ef;
  auVar43._20_4_ = 0x219392ef;
  auVar43._24_4_ = 0x219392ef;
  auVar43._28_4_ = 0x219392ef;
  auVar32 = vandps_avx(auVar4,auVar41);
  auVar32 = vcmpps_avx(auVar32,auVar43,1);
  auVar44 = vblendvps_avx(auVar4,auVar43,auVar32);
  auVar32 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar37 = vandps_avx(auVar32,auVar41);
  auVar37 = vcmpps_avx(auVar37,auVar43,1);
  auVar45 = vblendvps_avx(auVar32,auVar43,auVar37);
  auVar37 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar41 = vandps_avx(auVar37,auVar41);
  auVar41 = vcmpps_avx(auVar41,auVar43,1);
  auVar8 = vrcpps_avx(auVar44);
  auVar41 = vblendvps_avx(auVar37,auVar43,auVar41);
  auVar40._8_4_ = 0x3f800000;
  auVar40._0_8_ = 0x3f8000003f800000;
  auVar40._12_4_ = 0x3f800000;
  auVar40._16_4_ = 0x3f800000;
  auVar40._20_4_ = 0x3f800000;
  auVar40._24_4_ = 0x3f800000;
  auVar40._28_4_ = 0x3f800000;
  auVar29 = vfnmadd213ps_fma(auVar44,auVar8,auVar40);
  auVar44 = vrcpps_avx(auVar45);
  auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar41);
  auVar11 = vfnmadd213ps_fma(auVar45,auVar44,auVar40);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar44,auVar44);
  auVar12 = vfnmadd213ps_fma(auVar41,auVar8,auVar40);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar8,auVar8);
  auVar55 = ZEXT1664(auVar12);
  auVar41 = ZEXT1232(ZEXT812(0)) << 0x20;
  local_10e0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar41);
  local_1080 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar41);
  auVar41 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar4 = vcmpps_avx(auVar4,auVar41,1);
  auVar44._8_4_ = 1;
  auVar44._0_8_ = 0x100000001;
  auVar44._12_4_ = 1;
  auVar44._16_4_ = 1;
  auVar44._20_4_ = 1;
  auVar44._24_4_ = 1;
  auVar44._28_4_ = 1;
  auVar4 = vandps_avx(auVar4,auVar44);
  auVar32 = vcmpps_avx(auVar32,auVar41,1);
  auVar45._8_4_ = 2;
  auVar45._0_8_ = 0x200000002;
  auVar45._12_4_ = 2;
  auVar45._16_4_ = 2;
  auVar45._20_4_ = 2;
  auVar45._24_4_ = 2;
  auVar45._28_4_ = 2;
  auVar32 = vandps_avx(auVar32,auVar45);
  auVar32 = vorps_avx(auVar32,auVar4);
  auVar4 = vcmpps_avx(auVar37,auVar41,1);
  auVar37._8_4_ = 4;
  auVar37._0_8_ = 0x400000004;
  auVar37._12_4_ = 4;
  auVar37._16_4_ = 4;
  auVar37._20_4_ = 4;
  auVar37._24_4_ = 4;
  auVar37._28_4_ = 4;
  auVar4 = vandps_avx(auVar4,auVar37);
  auVar9 = vpor_avx2(auVar30 ^ auVar9,auVar4);
  local_10c0 = vpor_avx2(auVar9,auVar32);
  local_1020 = *(float *)ray;
  fStack_101c = *(float *)(ray + 4);
  fStack_1018 = *(float *)(ray + 8);
  fStack_1014 = *(float *)(ray + 0xc);
  fStack_1010 = *(float *)(ray + 0x10);
  fStack_100c = *(float *)(ray + 0x14);
  fStack_1008 = *(float *)(ray + 0x18);
  uStack_1004 = *(undefined4 *)(ray + 0x1c);
  auVar50._0_4_ = auVar29._0_4_ * -*(float *)ray;
  auVar50._4_4_ = auVar29._4_4_ * -*(float *)(ray + 4);
  auVar50._8_4_ = auVar29._8_4_ * -*(float *)(ray + 8);
  auVar50._12_4_ = auVar29._12_4_ * -*(float *)(ray + 0xc);
  auVar50._16_4_ = -*(float *)(ray + 0x10) * 0.0;
  auVar50._20_4_ = -*(float *)(ray + 0x14) * 0.0;
  auVar50._28_36_ = in_ZMM15._28_36_;
  auVar50._24_4_ = -*(float *)(ray + 0x18) * 0.0;
  auVar56 = ZEXT3264(auVar50._0_32_);
  local_1040 = *(float *)(ray + 0x20);
  fStack_103c = *(float *)(ray + 0x24);
  fStack_1038 = *(float *)(ray + 0x28);
  fStack_1034 = *(float *)(ray + 0x2c);
  fStack_1030 = *(float *)(ray + 0x30);
  fStack_102c = *(float *)(ray + 0x34);
  fStack_1028 = *(float *)(ray + 0x38);
  uStack_1024 = *(undefined4 *)(ray + 0x3c);
  local_1220 = ZEXT1632(auVar29);
  auVar51 = ZEXT3264(local_1220);
  local_1260._0_4_ = auVar11._0_4_ * -*(float *)(ray + 0x20);
  local_1260._4_4_ = auVar11._4_4_ * -*(float *)(ray + 0x24);
  local_1260._8_4_ = auVar11._8_4_ * -*(float *)(ray + 0x28);
  local_1260._12_4_ = auVar11._12_4_ * -*(float *)(ray + 0x2c);
  local_1260._16_4_ = -*(float *)(ray + 0x30) * 0.0;
  local_1260._20_4_ = -*(float *)(ray + 0x34) * 0.0;
  local_1260._24_4_ = -*(float *)(ray + 0x38) * 0.0;
  local_1260._28_4_ = 0;
  local_1060 = *(float *)(ray + 0x40);
  fStack_105c = *(float *)(ray + 0x44);
  fStack_1058 = *(float *)(ray + 0x48);
  fStack_1054 = *(float *)(ray + 0x4c);
  fStack_1050 = *(float *)(ray + 0x50);
  fStack_104c = *(float *)(ray + 0x54);
  fStack_1048 = *(float *)(ray + 0x58);
  uStack_1044 = *(undefined4 *)(ray + 0x5c);
  local_1240 = ZEXT1632(auVar11);
  auVar52 = ZEXT3264(local_1240);
  local_1000._0_4_ = auVar12._0_4_ * -*(float *)(ray + 0x40);
  local_1000._4_4_ = auVar12._4_4_ * -*(float *)(ray + 0x44);
  local_1000._8_4_ = auVar12._8_4_ * -*(float *)(ray + 0x48);
  local_1000._12_4_ = auVar12._12_4_ * -*(float *)(ray + 0x4c);
  local_1000._16_4_ = -*(float *)(ray + 0x50) * 0.0;
  local_1000._20_4_ = -*(float *)(ray + 0x54) * 0.0;
  local_1000._24_4_ = -*(float *)(ray + 0x58) * 0.0;
  local_1000._28_4_ = 0;
  auVar54 = ZEXT3264(local_1000);
  local_11d0 = 0x80000000;
  uStack_11cc = 0x80000000;
  uStack_11c8 = 0x80000000;
  uStack_11c4 = 0x80000000;
  local_10a0 = 0x7f800000;
  uStack_109c = 0x7f800000;
  uStack_1098 = 0x7f800000;
  uStack_1094 = 0x7f800000;
  uStack_1090 = 0x7f800000;
  uStack_108c = 0x7f800000;
  uStack_1088 = 0x7f800000;
  uStack_1084 = 0x7f800000;
  local_fc0 = ZEXT1632(auVar12);
  local_fe0 = auVar50._0_32_;
  local_12c0 = ray;
  local_12b8 = context;
LAB_0161ee74:
  lVar10 = 0;
  for (uVar23 = local_12d8; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar10 = lVar10 + 1;
  }
  uVar17 = *(undefined4 *)(local_10c0 + lVar10 * 4);
  auVar30._4_4_ = uVar17;
  auVar30._0_4_ = uVar17;
  auVar30._8_4_ = uVar17;
  auVar30._12_4_ = uVar17;
  auVar30._16_4_ = uVar17;
  auVar30._20_4_ = uVar17;
  auVar30._24_4_ = uVar17;
  auVar30._28_4_ = uVar17;
  auVar32 = vpcmpeqd_avx2(auVar30,local_10c0);
  uVar17 = vmovmskps_avx(auVar32);
  local_12d8 = ~CONCAT44((int)((ulong)lVar10 >> 0x20),uVar17) & local_12d8;
  auVar15._4_4_ = fStack_101c;
  auVar15._0_4_ = local_1020;
  auVar15._8_4_ = fStack_1018;
  auVar15._12_4_ = fStack_1014;
  auVar15._16_4_ = fStack_1010;
  auVar15._20_4_ = fStack_100c;
  auVar15._24_4_ = fStack_1008;
  auVar15._28_4_ = uStack_1004;
  auVar47._8_4_ = 0x7f800000;
  auVar47._0_8_ = 0x7f8000007f800000;
  auVar47._12_4_ = 0x7f800000;
  auVar47._16_4_ = 0x7f800000;
  auVar47._20_4_ = 0x7f800000;
  auVar47._24_4_ = 0x7f800000;
  auVar47._28_4_ = 0x7f800000;
  auVar9 = vblendvps_avx(auVar47,auVar15,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar29 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar8._4_4_ = fStack_103c;
  auVar8._0_4_ = local_1040;
  auVar8._8_4_ = fStack_1038;
  auVar8._12_4_ = fStack_1034;
  auVar8._16_4_ = fStack_1030;
  auVar8._20_4_ = fStack_102c;
  auVar8._24_4_ = fStack_1028;
  auVar8._28_4_ = uStack_1024;
  auVar9 = vblendvps_avx(auVar47,auVar8,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar11 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar4._4_4_ = fStack_105c;
  auVar4._0_4_ = local_1060;
  auVar4._8_4_ = fStack_1058;
  auVar4._12_4_ = fStack_1054;
  auVar4._16_4_ = fStack_1050;
  auVar4._20_4_ = fStack_104c;
  auVar4._24_4_ = fStack_1048;
  auVar4._28_4_ = uStack_1044;
  auVar9 = vblendvps_avx(auVar47,auVar4,auVar32);
  auVar11 = vunpcklps_avx(auVar29,auVar11);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar29 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar12 = vinsertps_avx(auVar11,auVar29,0x28);
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar49._16_4_ = 0xff800000;
  auVar49._20_4_ = 0xff800000;
  auVar49._24_4_ = 0xff800000;
  auVar49._28_4_ = 0xff800000;
  auVar9 = vblendvps_avx(auVar49,auVar15,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar29 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar49,auVar8,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar11 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar11 = vunpcklps_avx(auVar29,auVar11);
  auVar9 = vblendvps_avx(auVar49,auVar4,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar29 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar35 = vinsertps_avx(auVar11,auVar29,0x28);
  auVar9 = vblendvps_avx(auVar47,auVar51._0_32_,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar29 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar47,auVar52._0_32_,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar11 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar47,auVar55._0_32_,auVar32);
  auVar11 = vunpcklps_avx(auVar29,auVar11);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar29 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar39 = vinsertps_avx(auVar11,auVar29,0x28);
  auVar9 = vblendvps_avx(auVar49,auVar51._0_32_,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar29 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar49,auVar52._0_32_,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar11 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar11 = vunpcklps_avx(auVar29,auVar11);
  auVar9 = vblendvps_avx(auVar49,auVar55._0_32_,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar30);
  auVar29 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar6 = vinsertps_avx(auVar11,auVar29,0x28);
  auVar9 = vblendvps_avx(auVar47,local_10e0,auVar32);
  auVar30 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar30);
  auVar30 = vshufpd_avx(auVar9,auVar9,5);
  auVar30 = vminps_avx(auVar9,auVar30);
  local_12a0 = vblendvps_avx(auVar49,local_1080,auVar32);
  auVar9 = vshufps_avx(local_12a0,local_12a0,0xb1);
  auVar9 = vmaxps_avx(local_12a0,auVar9);
  auVar4 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar4);
  auVar5 = vcmpps_avx(auVar39,_DAT_01f45a50,5);
  auVar29 = vblendvps_avx(auVar6,auVar39,auVar5);
  auVar11 = vblendvps_avx(auVar12,auVar35,auVar5);
  auVar12 = vblendvps_avx(auVar35,auVar12,auVar5);
  local_1100 = auVar29._0_4_;
  auVar35 = vmovshdup_avx(auVar29);
  local_12d0 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x20;
  auVar35 = vshufpd_avx(auVar29,auVar29,1);
  uVar26 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x40;
  local_12a8 = local_12d0 ^ 0x10;
  auVar7 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar35 = vmaxss_avx(auVar9._0_16_,auVar9._16_16_);
  auVar50 = ZEXT1664(auVar35);
  auVar52 = ZEXT3264(local_1240);
  auVar5 = vblendvps_avx(auVar39,auVar6,auVar5);
  auVar39._0_4_ = auVar11._0_4_ * local_1100;
  auVar39._4_4_ = auVar11._4_4_ * auVar29._4_4_;
  auVar39._8_4_ = auVar11._8_4_ * auVar29._8_4_;
  auVar39._12_4_ = auVar11._12_4_ * auVar29._12_4_;
  auVar51 = ZEXT3264(local_1220);
  local_1160 = auVar5._0_4_;
  auVar35._0_4_ = auVar12._0_4_ * local_1160;
  auVar35._4_4_ = auVar12._4_4_ * auVar5._4_4_;
  auVar35._8_4_ = auVar12._8_4_ * auVar5._8_4_;
  auVar35._12_4_ = auVar12._12_4_ * auVar5._12_4_;
  local_12c8 = (ulong)(local_1100 < 0.0) << 4;
  uVar25 = local_12c8 ^ 0x10;
  local_fa0 = *(ulong *)&local_12e0[1].bounds.bounds0.lower.field_0;
  local_f98[0] = 0;
  local_1110 = (uint)auVar39._0_4_ ^ local_11d0;
  uStack_110c = (uint)auVar39._0_4_ ^ uStack_11cc;
  uStack_1108 = (uint)auVar39._0_4_ ^ uStack_11c8;
  uStack_1104 = (uint)auVar39._0_4_ ^ uStack_11c4;
  local_1120 = vshufps_avx(auVar29,auVar29,0x55);
  auVar11 = vshufps_avx(auVar39,auVar39,0x55);
  local_1130._0_4_ = auVar11._0_4_ ^ local_11d0;
  local_1130._4_4_ = auVar11._4_4_ ^ uStack_11cc;
  local_1130._8_4_ = auVar11._8_4_ ^ uStack_11c8;
  local_1130._12_4_ = auVar11._12_4_ ^ uStack_11c4;
  local_1140 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar29 = vshufps_avx(auVar39,auVar39,0xaa);
  local_1150 = auVar29._0_4_ ^ local_11d0;
  uStack_114c = auVar29._4_4_ ^ uStack_11cc;
  uStack_1148 = auVar29._8_4_ ^ uStack_11c8;
  uStack_1144 = auVar29._12_4_ ^ uStack_11c4;
  local_1170 = (uint)auVar35._0_4_ ^ local_11d0;
  uStack_116c = (uint)auVar35._0_4_ ^ uStack_11cc;
  uStack_1168 = (uint)auVar35._0_4_ ^ uStack_11c8;
  uStack_1164 = (uint)auVar35._0_4_ ^ uStack_11c4;
  local_1180 = vshufps_avx(auVar5,auVar5,0x55);
  auVar29 = vshufps_avx(auVar35,auVar35,0x55);
  local_1190._0_4_ = auVar29._0_4_ ^ local_11d0;
  local_1190._4_4_ = auVar29._4_4_ ^ uStack_11cc;
  local_1190._8_4_ = auVar29._8_4_ ^ uStack_11c8;
  local_1190._12_4_ = auVar29._12_4_ ^ uStack_11c4;
  local_11a0 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar29 = vshufps_avx(auVar35,auVar35,0xaa);
  local_11b0 = auVar29._0_4_ ^ local_11d0;
  uStack_11ac = auVar29._4_4_ ^ uStack_11cc;
  uStack_11a8 = auVar29._8_4_ ^ uStack_11c8;
  uStack_11a4 = auVar29._12_4_ ^ uStack_11c4;
  local_11c0 = auVar7._0_4_;
  auVar9._4_4_ = uStack_109c;
  auVar9._0_4_ = local_10a0;
  auVar9._8_4_ = uStack_1098;
  auVar9._12_4_ = uStack_1094;
  auVar9._16_4_ = uStack_1090;
  auVar9._20_4_ = uStack_108c;
  auVar9._24_4_ = uStack_1088;
  auVar9._28_4_ = uStack_1084;
  local_1200 = vblendvps_avx(auVar9,local_10e0,auVar32);
  auVar53 = ZEXT3264(local_1260);
  puVar27 = local_f90;
  uVar23 = local_12c8;
  uVar24 = local_12d0;
  uStack_11bc = local_11c0;
  uStack_11b8 = local_11c0;
  uStack_11b4 = local_11c0;
  fStack_115c = local_1160;
  fStack_1158 = local_1160;
  fStack_1154 = local_1160;
  fStack_10fc = local_1100;
  fStack_10f8 = local_1100;
  fStack_10f4 = local_1100;
  do {
    local_1270 = auVar50._0_16_;
    uVar17 = auVar50._0_4_;
    auVar29._4_4_ = uVar17;
    auVar29._0_4_ = uVar17;
    auVar29._8_4_ = uVar17;
    auVar29._12_4_ = uVar17;
LAB_0161f2c0:
    do {
      if (puVar27 == &local_fa0) {
        if (local_12d8 == 0) {
          return;
        }
        goto LAB_0161ee74;
      }
      uVar17 = (undefined4)puVar27[-1];
      auVar32._4_4_ = uVar17;
      auVar32._0_4_ = uVar17;
      auVar32._8_4_ = uVar17;
      auVar32._12_4_ = uVar17;
      auVar32._16_4_ = uVar17;
      auVar32._20_4_ = uVar17;
      auVar32._24_4_ = uVar17;
      auVar32._28_4_ = uVar17;
      auVar50 = ZEXT3264(auVar32);
      puVar27 = puVar27 + -2;
      auVar9 = vcmpps_avx(auVar32,local_12a0,1);
    } while ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar9 >> 0x7f,0) == '\0') &&
               (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar9 >> 0xbf,0) == '\0') &&
             (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]
            );
    uVar18 = *puVar27;
LAB_0161f2ef:
    if ((uVar18 & 8) == 0) {
      auVar13._4_4_ = uStack_110c;
      auVar13._0_4_ = local_1110;
      auVar13._8_4_ = uStack_1108;
      auVar13._12_4_ = uStack_1104;
      auVar14._4_4_ = fStack_10fc;
      auVar14._0_4_ = local_1100;
      auVar14._8_4_ = fStack_10f8;
      auVar14._12_4_ = fStack_10f4;
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar23),auVar13,auVar14);
      auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar24),local_1130,local_1120
                               );
      auVar11 = vpmaxsd_avx(auVar11,auVar12);
      auVar7._4_4_ = uStack_114c;
      auVar7._0_4_ = local_1150;
      auVar7._8_4_ = uStack_1148;
      auVar7._12_4_ = uStack_1144;
      auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar26),auVar7,local_1140);
      auVar5._4_4_ = uStack_11bc;
      auVar5._0_4_ = local_11c0;
      auVar5._8_4_ = uStack_11b8;
      auVar5._12_4_ = uStack_11b4;
      auVar12 = vpmaxsd_avx(auVar12,auVar5);
      local_10f0 = vpmaxsd_avx(auVar11,auVar12);
      auVar11._4_4_ = uStack_116c;
      auVar11._0_4_ = local_1170;
      auVar11._8_4_ = uStack_1168;
      auVar11._12_4_ = uStack_1164;
      auVar6._4_4_ = fStack_115c;
      auVar6._0_4_ = local_1160;
      auVar6._8_4_ = fStack_1158;
      auVar6._12_4_ = fStack_1154;
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar25),auVar11,auVar6);
      auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar18 + 0x20 + local_12a8),local_1190,
                                local_1180);
      auVar11 = vpminsd_avx(auVar11,auVar12);
      auVar12._4_4_ = uStack_11ac;
      auVar12._0_4_ = local_11b0;
      auVar12._8_4_ = uStack_11a8;
      auVar12._12_4_ = uStack_11a4;
      auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar18 + 0x20 + (uVar26 ^ 0x10)),auVar12,
                                local_11a0);
      auVar12 = vpminsd_avx(auVar12,auVar29);
      auVar11 = vpminsd_avx(auVar11,auVar12);
      auVar11 = vcmpps_avx(local_10f0,auVar11,2);
      uVar16 = vmovmskps_avx(auVar11);
      if (uVar16 != 0) {
        uVar22 = (ulong)(uVar16 & 0xff);
        auVar50 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        uVar21 = 0;
        uVar19 = 8;
        do {
          lVar10 = 0;
          for (uVar20 = uVar22; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar17 = *(undefined4 *)(uVar18 + 0x20 + lVar10 * 4);
          auVar33._4_4_ = uVar17;
          auVar33._0_4_ = uVar17;
          auVar33._8_4_ = uVar17;
          auVar33._12_4_ = uVar17;
          auVar33._16_4_ = uVar17;
          auVar33._20_4_ = uVar17;
          auVar33._24_4_ = uVar17;
          auVar33._28_4_ = uVar17;
          uVar17 = *(undefined4 *)(uVar18 + 0x40 + lVar10 * 4);
          auVar36._4_4_ = uVar17;
          auVar36._0_4_ = uVar17;
          auVar36._8_4_ = uVar17;
          auVar36._12_4_ = uVar17;
          auVar36._16_4_ = uVar17;
          auVar36._20_4_ = uVar17;
          auVar36._24_4_ = uVar17;
          auVar36._28_4_ = uVar17;
          auVar11 = vfmadd213ps_fma(auVar33,auVar51._0_32_,auVar56._0_32_);
          auVar12 = vfmadd213ps_fma(auVar36,auVar52._0_32_,auVar53._0_32_);
          uVar17 = *(undefined4 *)(uVar18 + 0x60 + lVar10 * 4);
          auVar38._4_4_ = uVar17;
          auVar38._0_4_ = uVar17;
          auVar38._8_4_ = uVar17;
          auVar38._12_4_ = uVar17;
          auVar38._16_4_ = uVar17;
          auVar38._20_4_ = uVar17;
          auVar38._24_4_ = uVar17;
          auVar38._28_4_ = uVar17;
          auVar5 = vfmadd213ps_fma(auVar38,auVar55._0_32_,auVar54._0_32_);
          uVar17 = *(undefined4 *)(uVar18 + 0x30 + lVar10 * 4);
          auVar42._4_4_ = uVar17;
          auVar42._0_4_ = uVar17;
          auVar42._8_4_ = uVar17;
          auVar42._12_4_ = uVar17;
          auVar42._16_4_ = uVar17;
          auVar42._20_4_ = uVar17;
          auVar42._24_4_ = uVar17;
          auVar42._28_4_ = uVar17;
          auVar35 = vfmadd213ps_fma(auVar42,auVar51._0_32_,auVar56._0_32_);
          uVar17 = *(undefined4 *)(uVar18 + 0x50 + lVar10 * 4);
          auVar46._4_4_ = uVar17;
          auVar46._0_4_ = uVar17;
          auVar46._8_4_ = uVar17;
          auVar46._12_4_ = uVar17;
          auVar46._16_4_ = uVar17;
          auVar46._20_4_ = uVar17;
          auVar46._24_4_ = uVar17;
          auVar46._28_4_ = uVar17;
          uVar17 = *(undefined4 *)(uVar18 + 0x70 + lVar10 * 4);
          auVar48._4_4_ = uVar17;
          auVar48._0_4_ = uVar17;
          auVar48._8_4_ = uVar17;
          auVar48._12_4_ = uVar17;
          auVar48._16_4_ = uVar17;
          auVar48._20_4_ = uVar17;
          auVar48._24_4_ = uVar17;
          auVar48._28_4_ = uVar17;
          auVar39 = vfmadd213ps_fma(auVar46,auVar52._0_32_,auVar53._0_32_);
          auVar6 = vfmadd213ps_fma(auVar48,auVar55._0_32_,auVar54._0_32_);
          auVar9 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar35));
          auVar30 = vpminsd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar39));
          auVar9 = vpmaxsd_avx2(auVar9,auVar30);
          auVar30 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar6));
          auVar30 = vpmaxsd_avx2(auVar30,local_1200);
          auVar9 = vpmaxsd_avx2(auVar9,auVar30);
          auVar30 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar35));
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar39));
          auVar4 = vpminsd_avx2(auVar30,auVar4);
          auVar30 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar6));
          auVar30 = vpminsd_avx2(auVar30,local_12a0);
          auVar30 = vpminsd_avx2(auVar4,auVar30);
          auVar9 = vcmpps_avx(auVar9,auVar30,2);
          uVar20 = uVar19;
          if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0x7f,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0xbf,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar9[0x1f] < '\0') {
            uVar17 = *(undefined4 *)(local_10f0 + lVar10 * 4);
            auVar31._4_4_ = uVar17;
            auVar31._0_4_ = uVar17;
            auVar31._8_4_ = uVar17;
            auVar31._12_4_ = uVar17;
            auVar34._16_4_ = uVar17;
            auVar34._0_16_ = auVar31;
            auVar34._20_4_ = uVar17;
            auVar34._24_4_ = uVar17;
            auVar34._28_4_ = uVar17;
            uVar20 = *(ulong *)(uVar18 + lVar10 * 8);
            auVar9 = vcmpps_avx(auVar34,auVar50._0_32_,1);
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar9 >> 0x7f,0) == '\0') &&
                  (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar9 >> 0xbf,0) == '\0') &&
                (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar9[0x1f]) {
              *puVar27 = uVar20;
              uVar20 = uVar19;
            }
            else {
              if (uVar19 == 8) {
                auVar50 = ZEXT3264(auVar34);
                goto LAB_0161f4d6;
              }
              *puVar27 = uVar19;
              auVar31 = auVar50._0_16_;
              auVar50 = ZEXT3264(auVar34);
            }
            uVar21 = uVar21 + 1;
            *(int *)(puVar27 + 1) = auVar31._0_4_;
            puVar27 = puVar27 + 2;
          }
LAB_0161f4d6:
          uVar22 = uVar22 - 1 & uVar22;
          uVar19 = uVar20;
        } while (uVar22 != 0);
        if (uVar20 == 8) goto LAB_0161f2c0;
        uVar18 = uVar20;
        if (1 < uVar21) {
          pauVar1 = (undefined1 (*) [16])(puVar27 + -4);
          puVar2 = puVar27 + -2;
          if ((uint)puVar27[-3] < (uint)puVar27[-1]) {
            *(int *)(puVar27 + -3) = (int)puVar27[-1];
            *(ulong *)*pauVar1 = *puVar2;
            local_1300._0_8_ = SUB168(*pauVar1,0);
            *puVar2 = local_1300._0_8_;
            local_1300.i[2] = SUB164(*pauVar1,8);
            *(float *)(puVar27 + -1) = local_1300.v[2];
          }
          if (uVar21 != 2) {
            pauVar3 = (undefined1 (*) [16])(puVar27 + -6);
            uVar16 = (uint)puVar27[-5];
            if (uVar16 < (uint)puVar27[-1]) {
              *(int *)(puVar27 + -5) = (int)puVar27[-1];
              *(ulong *)*pauVar3 = *puVar2;
              local_1300._0_8_ = SUB168(*pauVar3,0);
              *puVar2 = local_1300._0_8_;
              local_1300.i[2] = SUB164(*pauVar3,8);
              *(float *)(puVar27 + -1) = local_1300.v[2];
              uVar16 = (uint)puVar27[-5];
            }
            if (uVar16 < (uint)puVar27[-3]) {
              auVar11 = *pauVar3;
              *(int *)(puVar27 + -5) = (int)puVar27[-3];
              *(undefined8 *)*pauVar3 = *(undefined8 *)*pauVar1;
              local_1300._0_8_ = auVar11._0_8_;
              *(undefined8 *)*pauVar1 = local_1300._0_8_;
              local_1300.i[2] = auVar11._8_4_;
              *(float *)(puVar27 + -3) = local_1300.v[2];
            }
          }
        }
        goto LAB_0161f2ef;
      }
      goto LAB_0161f2c0;
    }
    local_1300 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                 vcmpps_avx(local_12a0,auVar50._0_32_,6);
    if (((((((((undefined1  [32])local_1300 >> 0x1f & (undefined1  [32])0x1) ==
              (undefined1  [32])0x0 &&
             ((undefined1  [32])local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
             ) && ((undefined1  [32])local_1300 >> 0x5f & (undefined1  [32])0x1) ==
                  (undefined1  [32])0x0) && SUB321((undefined1  [32])local_1300 >> 0x7f,0) == '\0')
          && ((undefined1  [32])local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
          ) && SUB321((undefined1  [32])local_1300 >> 0xbf,0) == '\0') &&
        ((undefined1  [32])local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_1300.i[7]._3_1_) goto LAB_0161f6c4;
    local_12b0 = (ulong)((uint)uVar18 & 0xf) - 8;
    prim = (Primitive_conflict4 *)(uVar18 & 0xfffffffffffffff0);
    while (bVar28 = local_12b0 != 0, local_12b0 = local_12b0 + -1, bVar28) {
      InstanceArrayIntersectorK<8>::intersect
                ((vbool<8> *)&local_1300.field_1,&local_1301,ray,local_12b8,prim);
      auVar54 = ZEXT3264(local_1000);
      auVar56 = ZEXT3264(local_fe0);
      auVar55 = ZEXT3264(local_fc0);
      prim = prim + 1;
      ray = local_12c0;
    }
    auVar9 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),local_12a0,1);
    auVar9 = (undefined1  [32])local_1300 & auVar9;
    uVar23 = local_12c8;
    uVar24 = local_12d0;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar9 >> 0x7f,0) == '\0') &&
          (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar9 >> 0xbf,0) == '\0') &&
        (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]) {
      auVar51 = ZEXT3264(local_1220);
      auVar52 = ZEXT3264(local_1240);
      auVar53 = ZEXT3264(local_1260);
LAB_0161f6c4:
      auVar50 = ZEXT1664(local_1270);
    }
    else {
      local_12a0 = vblendvps_avx(local_12a0,*(undefined1 (*) [32])(ray + 0x100),
                                 (undefined1  [32])local_1300);
      auVar9 = vshufps_avx(local_12a0,local_12a0,0xb1);
      auVar9 = vmaxps_avx(local_12a0,auVar9);
      auVar30 = vshufpd_avx(auVar9,auVar9,5);
      auVar9 = vmaxps_avx(auVar9,auVar30);
      auVar29 = vmaxss_avx(auVar9._0_16_,auVar9._16_16_);
      auVar50 = ZEXT1664(auVar29);
      auVar51 = ZEXT3264(local_1220);
      auVar52 = ZEXT3264(local_1240);
      auVar53 = ZEXT3264(local_1260);
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }